

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obu.c
# Opt level: O2

void alloc_read_metadata(AV1Decoder *pbi,OBU_METADATA_TYPE metadata_type,uint8_t *data,size_t sz,
                        aom_metadata_insert_flags_t insert_flag)

{
  size_t sVar1;
  aom_metadata_array_t *paVar2;
  aom_metadata_t *metadata;
  aom_metadata_t **ppaVar3;
  
  if (pbi->metadata == (aom_metadata_array_t *)0x0) {
    paVar2 = aom_img_metadata_array_alloc(0);
    pbi->metadata = paVar2;
    if (paVar2 == (aom_metadata_array_t *)0x0) {
      aom_internal_error(&pbi->error,AOM_CODEC_MEM_ERROR,"Failed to allocate metadata array");
    }
  }
  metadata = aom_img_metadata_alloc(metadata_type,data,sz,insert_flag);
  if (metadata == (aom_metadata_t *)0x0) {
    aom_internal_error(&pbi->error,AOM_CODEC_MEM_ERROR,"Error allocating metadata");
  }
  ppaVar3 = (aom_metadata_t **)realloc(pbi->metadata->metadata_array,pbi->metadata->sz * 8 + 8);
  if (ppaVar3 == (aom_metadata_t **)0x0) {
    aom_img_metadata_free(metadata);
    aom_internal_error(&pbi->error,AOM_CODEC_MEM_ERROR,"Error growing metadata array");
  }
  paVar2 = pbi->metadata;
  paVar2->metadata_array = ppaVar3;
  sVar1 = paVar2->sz;
  ppaVar3[sVar1] = metadata;
  paVar2->sz = sVar1 + 1;
  return;
}

Assistant:

static void alloc_read_metadata(AV1Decoder *const pbi,
                                OBU_METADATA_TYPE metadata_type,
                                const uint8_t *data, size_t sz,
                                aom_metadata_insert_flags_t insert_flag) {
  if (!pbi->metadata) {
    pbi->metadata = aom_img_metadata_array_alloc(0);
    if (!pbi->metadata) {
      aom_internal_error(&pbi->error, AOM_CODEC_MEM_ERROR,
                         "Failed to allocate metadata array");
    }
  }
  aom_metadata_t *metadata =
      aom_img_metadata_alloc(metadata_type, data, sz, insert_flag);
  if (!metadata) {
    aom_internal_error(&pbi->error, AOM_CODEC_MEM_ERROR,
                       "Error allocating metadata");
  }
  aom_metadata_t **metadata_array =
      (aom_metadata_t **)realloc(pbi->metadata->metadata_array,
                                 (pbi->metadata->sz + 1) * sizeof(metadata));
  if (!metadata_array) {
    aom_img_metadata_free(metadata);
    aom_internal_error(&pbi->error, AOM_CODEC_MEM_ERROR,
                       "Error growing metadata array");
  }
  pbi->metadata->metadata_array = metadata_array;
  pbi->metadata->metadata_array[pbi->metadata->sz] = metadata;
  pbi->metadata->sz++;
}